

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int process_control_data_message(proxy_conn_handle *pc,proxy_msg *msg)

{
  uint32_t addr_00;
  undefined8 *puVar1;
  proxy_handle *ph;
  int iVar2;
  char *pcVar3;
  size_t local_48;
  size_t curr_msg_size;
  int ret;
  uint32_t addr;
  size_t msg_size;
  proxy_conn_priv *priv;
  proxy_msg *msg_local;
  proxy_conn_handle *pc_local;
  
  puVar1 = (undefined8 *)pc->priv;
  _ret = (ulong)msg->size;
  addr_00 = msg->address;
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Processing UDP_CONTROL message (%zu bytes) from client \'%s\'\n"
            ,_ret,puVar1 + 0x21b);
  while( true ) {
    if (_ret == 0) {
      return 0;
    }
    if (_ret < 0x1001) {
      local_48 = _ret;
    }
    else {
      local_48 = 0x1000;
    }
    iVar2 = conn_recv((conn_handle *)*puVar1,&msg->type,local_48);
    if (iVar2 < 0) break;
    if (iVar2 == 0) {
      return -0x20;
    }
    _ret = _ret - (long)iVar2;
    iVar2 = conn_send_to((conn_handle *)(puVar1 + 1),&msg->type,(long)iVar2,addr_00,0x144f);
    if (iVar2 < 0) {
      ph = pc->ph;
      pcVar3 = strerror(-iVar2);
      proxy_log(ph,LOG_LEVEL_WARN,
                "Failed to send UDP_CONTROL packet of size %zu to client \'%s\': %d (%s)\n",local_48
                ,puVar1 + 0x21b,(ulong)(uint)-iVar2,pcVar3);
    }
  }
  return iVar2;
}

Assistant:

static int process_control_data_message(struct proxy_conn_handle *pc,
					struct proxy_msg *msg)
{
	struct proxy_conn_priv *priv = pc->priv;
	size_t msg_size = msg->size;
	uint32_t addr = msg->address;
	int ret;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Processing UDP_CONTROL message (%zu bytes) from client '%s'\n",
		  msg_size, priv->callsign);

	while (msg_size > 0) {
		size_t curr_msg_size = msg_size > CONN_BUFF_LEN ?
				       CONN_BUFF_LEN : msg_size;

		/* Get the data segment from the client */
		ret = conn_recv(priv->conn_client, (void *)msg, curr_msg_size);
		if (ret < 0)
			return ret;
		else if (ret == 0)
			return -EPIPE;

		msg_size -= ret;

		/* Send the data */
		ret = conn_send_to(&priv->conn_control, (void *)msg, ret, addr, 5199);
		if (ret < 0)
			proxy_log(pc->ph, LOG_LEVEL_WARN,
				  "Failed to send UDP_CONTROL packet of size %zu to client '%s': %d (%s)\n",
				  curr_msg_size, priv->callsign, -ret,
				  strerror(-ret));
			/*! @TODO Drop? */
	}

	return 0;
}